

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

void ethash_calculate_dag_item(node *ret,uint32_t node_index,ethash_light_t light)

{
  ulong uVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long *in_RDX;
  uint in_ESI;
  uint *in_RDI;
  uint w;
  node *parent;
  uint32_t parent_index;
  uint32_t i;
  node *init;
  node *cache_nodes;
  uint32_t num_parent_nodes;
  uint8_t *in_stack_ffffffffffffffa8;
  uint8_t *ret_00;
  uint local_44;
  uint local_34;
  
  uVar1 = in_RDX[1];
  puVar2 = (uint8_t *)*in_RDX;
  ret_00 = puVar2;
  memcpy(in_RDI,puVar2 + ((ulong)in_ESI % (uVar1 >> 6 & 0xffffffff)) * 0x40,0x40);
  *in_RDI = in_ESI ^ *in_RDI;
  SHA3_512(ret_00,in_stack_ffffffffffffffa8,0x15441c);
  for (local_34 = 0; local_34 != 0x100; local_34 = local_34 + 1) {
    uVar3 = fnv_hash(in_ESI ^ local_34,in_RDI[local_34 & 0xf]);
    for (local_44 = 0; local_44 != 0x10; local_44 = local_44 + 1) {
      uVar4 = fnv_hash(in_RDI[local_44],
                       *(uint32_t *)
                        (puVar2 + (ulong)local_44 * 4 + (ulong)(uVar3 % (uint)(uVar1 >> 6)) * 0x40))
      ;
      in_RDI[local_44] = uVar4;
    }
  }
  SHA3_512(ret_00,in_stack_ffffffffffffffa8,0x1544dc);
  return;
}

Assistant:

void ethash_calculate_dag_item(
	node* const ret,
	uint32_t node_index,
	ethash_light_t const light
)
{
	uint32_t num_parent_nodes = (uint32_t) (light->cache_size / sizeof(node));
	node const* cache_nodes = (node const *) light->cache;
	node const* init = &cache_nodes[node_index % num_parent_nodes];
	memcpy(ret, init, sizeof(node));
	ret->words[0] ^= node_index;
	SHA3_512(ret->bytes, ret->bytes, sizeof(node));
#if defined(_M_X64) && ENABLE_SSE
	__m128i const fnv_prime = _mm_set1_epi32(FNV_PRIME);
	__m128i xmm0 = ret->xmm[0];
	__m128i xmm1 = ret->xmm[1];
	__m128i xmm2 = ret->xmm[2];
	__m128i xmm3 = ret->xmm[3];
#endif

	for (uint32_t i = 0; i != ETHASH_DATASET_PARENTS; ++i) {
		uint32_t parent_index = fnv_hash(node_index ^ i, ret->words[i % NODE_WORDS]) % num_parent_nodes;
		node const *parent = &cache_nodes[parent_index];

#if defined(_M_X64) && ENABLE_SSE
		{
			xmm0 = _mm_mullo_epi32(xmm0, fnv_prime);
			xmm1 = _mm_mullo_epi32(xmm1, fnv_prime);
			xmm2 = _mm_mullo_epi32(xmm2, fnv_prime);
			xmm3 = _mm_mullo_epi32(xmm3, fnv_prime);
			xmm0 = _mm_xor_si128(xmm0, parent->xmm[0]);
			xmm1 = _mm_xor_si128(xmm1, parent->xmm[1]);
			xmm2 = _mm_xor_si128(xmm2, parent->xmm[2]);
			xmm3 = _mm_xor_si128(xmm3, parent->xmm[3]);

			// have to write to ret as values are used to compute index
			ret->xmm[0] = xmm0;
			ret->xmm[1] = xmm1;
			ret->xmm[2] = xmm2;
			ret->xmm[3] = xmm3;
		}
		#else
		{
			for (unsigned w = 0; w != NODE_WORDS; ++w) {
				ret->words[w] = fnv_hash(ret->words[w], parent->words[w]);
			}
		}
#endif
	}
	SHA3_512(ret->bytes, ret->bytes, sizeof(node));
}